

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsound_mame.c
# Opt level: O3

void qsound_update(void *param,UINT32 samples,DEV_SMPL **outputs)

{
  uint *puVar1;
  size_t __n;
  ushort uVar2;
  ushort uVar3;
  long lVar4;
  long lVar5;
  ulong uVar6;
  uint uVar7;
  ushort uVar8;
  uint uVar9;
  int iVar10;
  
  __n = (ulong)samples * 4;
  memset(*outputs,0,__n);
  memset(outputs[1],0,__n);
  lVar4 = *(long *)((long)param + 0x260);
  if ((lVar4 != 0) && (*(int *)((long)param + 0x268) != 0)) {
    lVar5 = 0;
    do {
      if ((*(char *)((long)param + lVar5 * 0x24 + 0x32) != '\0') &&
         (puVar1 = (uint *)((long)param + lVar5 * 0x24 + 0x20),
         (char)puVar1[8] == '\0' && samples != 0)) {
        uVar2 = *(ushort *)((long)puVar1 + 10);
        uVar6 = 0;
        do {
          uVar7 = (puVar1[7] >> 0xc) + puVar1[1];
          puVar1[1] = uVar7;
          uVar9 = (puVar1[7] & 0xfff) + puVar1[3];
          puVar1[7] = uVar9;
          if (uVar2 <= uVar7) {
            uVar3 = (ushort)puVar1[2];
            if (uVar3 == 0) {
              puVar1[1] = uVar7 - 1;
              puVar1[7] = uVar9 + 0x1000;
              break;
            }
            uVar8 = uVar2 - uVar3;
            if (uVar7 - uVar3 < (uint)uVar2) {
              uVar8 = (ushort)(uVar7 - uVar3);
            }
            uVar7 = (uint)uVar8;
            puVar1[1] = uVar7;
          }
          iVar10 = (uint)(ushort)puVar1[4] *
                   (int)*(char *)(lVar4 + (ulong)((uVar7 | *puVar1) & *(uint *)((long)param + 0x26c)
                                                 ));
          (*outputs)[uVar6] = (*outputs)[uVar6] + ((int)(puVar1[5] * iVar10) >> 0xe);
          outputs[1][uVar6] = outputs[1][uVar6] + ((int)(iVar10 * puVar1[6]) >> 0xe);
          uVar6 = uVar6 + 1;
        } while (samples != uVar6);
      }
      lVar5 = lVar5 + 1;
    } while (lVar5 != 0x10);
  }
  return;
}

Assistant:

static void qsound_update(void *param, UINT32 samples, DEV_SMPL **outputs)
{
	qsound_state *chip = (qsound_state *)param;
	UINT32 i,j;
	UINT32 offset;
	INT8 sample;
	qsound_channel *pC;

	// Clear the buffers
	memset(outputs[0], 0, samples * sizeof(*outputs[0]));
	memset(outputs[1], 0, samples * sizeof(*outputs[1]));
	if (chip->sample_rom == NULL || ! chip->sample_rom_length)
		return;

	for (j = 0; j < QSOUND_CHANNELS; j++)
	{
		pC=&chip->channel[j];
		if (pC->enabled && ! pC->Muted)
		{
			// Go through the buffer and add voice contributions
			for (i = 0; i < samples; i++)
			{
				pC->address += (pC->step_ptr >> 12);
				pC->step_ptr &= 0xfff;
				pC->step_ptr += pC->freq;

				if (pC->address >= pC->end)
				{
					if (pC->loop)
					{
						// Reached the end, restart the loop
						pC->address -= pC->loop;

						// Make sure we don't overflow (what does the real chip do in this case?)
						if (pC->address >= pC->end)
							pC->address = pC->end - pC->loop;

						pC->address &= 0xffff;
					}
					else
					{
						// Reached the end of a non-looped sample
						//pC->enabled = 0;
						pC->address --;	// ensure that old ripped VGMs still work
						pC->step_ptr += 0x1000;
						break;
					}
				}
				
				offset = pC->bank | pC->address;
				sample = chip->sample_rom[offset & chip->sample_rom_mask];
				outputs[0][i] += ((sample * pC->lvol * pC->vol) >> 14);
				outputs[1][i] += ((sample * pC->rvol * pC->vol) >> 14);
			}
		}
	}
}